

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_XMLProperty * __thiscall
ON_XMLNodePrivate::AttachProperty(ON_XMLNodePrivate *this,ON_XMLProperty *prop)

{
  ON_wString *this_00;
  wchar_t *name;
  lock_guard<std::recursive_mutex> local_28;
  lock_guard<std::recursive_mutex> lg;
  ON_XMLProperty *prop_local;
  ON_XMLNodePrivate *this_local;
  
  if (prop == (ON_XMLProperty *)0x0) {
    this_local = (ON_XMLNodePrivate *)0x0;
  }
  else {
    lg._M_device = (mutex_type *)prop;
    std::lock_guard<std::recursive_mutex>::lock_guard(&local_28,&this->m_mutex);
    this_00 = (ON_wString *)
              (**(code **)(((lg._M_device)->super___recursive_mutex_base)._M_mutex.__align + 0x10))
                        ();
    name = ON_wString::operator_cast_to_wchar_t_(this_00);
    RemoveProperty(this,name);
    *(ON_XMLProperty **)
     (*(long *)((long)&((lg._M_device)->super___recursive_mutex_base)._M_mutex + 8) + 0x10) =
         this->m_first_property;
    this->m_first_property = (ON_XMLProperty *)lg._M_device;
    this->m_first_property->_private->_owner = this->m_node;
    this_local = (ON_XMLNodePrivate *)lg._M_device;
    std::lock_guard<std::recursive_mutex>::~lock_guard(&local_28);
  }
  return (ON_XMLProperty *)this_local;
}

Assistant:

ON_XMLProperty* ON_XMLNodePrivate::AttachProperty(ON_XMLProperty* prop)
{
  if (nullptr == prop)
    return nullptr;

  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  RemoveProperty(prop->Name());

  prop->_private->_next = m_first_property;
  m_first_property = prop;
  m_first_property->_private->_owner = &m_node;

  return prop;
}